

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Zyx_ManAddCnfStart(Zyx_Man_t *p)

{
  int iVar1;
  int local_b0;
  int local_ac;
  int nLits_1;
  int nLits;
  int pLits [32];
  int local_20;
  int local_1c;
  int k;
  int i;
  Zyx_Man_t *p_local;
  
  local_1c = p->pPars->nVars;
  while( true ) {
    if (p->nObjs <= local_1c) {
      local_20 = 0;
      while( true ) {
        if (p->nObjs + -1 <= local_20) {
          if (p->pPars->nLutSize == 2) {
            for (local_1c = p->pPars->nVars; local_1c < p->nObjs; local_1c = local_1c + 1) {
              for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
                iVar1 = Zyx_FuncVar(p,local_1c,1);
                nLits_1 = Abc_Var2Lit(iVar1,(uint)(local_20 == 1));
                iVar1 = Zyx_FuncVar(p,local_1c,2);
                nLits = Abc_Var2Lit(iVar1,(uint)(local_20 == 2));
                iVar1 = Zyx_FuncVar(p,local_1c,3);
                pLits[0] = Abc_Var2Lit(iVar1,(uint)(local_20 != 0));
                iVar1 = bmcg_sat_solver_addclause(p->pSat,&nLits_1,3);
                if (iVar1 == 0) {
                  return 0;
                }
              }
              if (p->pPars->fOnlyAnd != 0) {
                iVar1 = Zyx_FuncVar(p,local_1c,1);
                nLits_1 = Abc_Var2Lit(iVar1,1);
                iVar1 = Zyx_FuncVar(p,local_1c,2);
                nLits = Abc_Var2Lit(iVar1,1);
                iVar1 = Zyx_FuncVar(p,local_1c,3);
                pLits[0] = Abc_Var2Lit(iVar1,0);
                iVar1 = bmcg_sat_solver_addclause(p->pSat,&nLits_1,3);
                if (iVar1 == 0) {
                  return 0;
                }
              }
            }
          }
          return 1;
        }
        local_b0 = 0;
        for (local_1c = p->pPars->nVars; local_1c < p->nObjs; local_1c = local_1c + 1) {
          iVar1 = Zyx_TopoVar(p,local_1c,local_20);
          iVar1 = Abc_Var2Lit(iVar1,0);
          (&nLits_1)[local_b0] = iVar1;
          local_b0 = local_b0 + 1;
        }
        if (local_b0 < 1) break;
        iVar1 = bmcg_sat_solver_addclause(p->pSat,&nLits_1,local_b0);
        if (iVar1 == 0) {
          return 0;
        }
        local_20 = local_20 + 1;
      }
      __assert_fail("nLits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                    ,0x2a2,"int Zyx_ManAddCnfStart(Zyx_Man_t *)");
    }
    local_ac = 0;
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      iVar1 = Zyx_TopoVar(p,local_1c,local_20);
      iVar1 = Abc_Var2Lit(iVar1,0);
      (&nLits_1)[local_ac] = iVar1;
      local_ac = local_ac + 1;
    }
    if (local_ac < 1) break;
    iVar1 = bmcg_sat_solver_addclause(p->pSat,&nLits_1,local_ac);
    if (iVar1 == 0) {
      return 0;
    }
    local_1c = local_1c + 1;
  }
  __assert_fail("nLits > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                ,0x297,"int Zyx_ManAddCnfStart(Zyx_Man_t *)");
}

Assistant:

int Zyx_ManAddCnfStart( Zyx_Man_t * p )
{
    // nodes have fanins
    int i, k, pLits[MAJ3_OBJS];
    //printf( "Adding initial clauses:\n" );
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nLits = 0;
        for ( k = 0; k < i; k++ )
            pLits[nLits++] = Abc_Var2Lit( Zyx_TopoVar(p, i, k), 0 );
        assert( nLits > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            return 0;
    }
 
    // nodes have fanouts
    for ( k = 0; k < p->nObjs-1; k++ )
    {
        int nLits = 0;
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
            pLits[nLits++] = Abc_Var2Lit( Zyx_TopoVar(p, i, k), 0 );
        assert( nLits > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            return 0;
    }
 
    // two input functions
    if ( p->pPars->nLutSize != 2 )
        return 1;
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            pLits[0] = Abc_Var2Lit( Zyx_FuncVar(p, i, 1), k==1 );
            pLits[1] = Abc_Var2Lit( Zyx_FuncVar(p, i, 2), k==2 );
            pLits[2] = Abc_Var2Lit( Zyx_FuncVar(p, i, 3), k!=0 );
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, 3 ) )
                return 0;
        }
        if ( p->pPars->fOnlyAnd )
        {
            pLits[0] = Abc_Var2Lit( Zyx_FuncVar(p, i, 1), 1 );
            pLits[1] = Abc_Var2Lit( Zyx_FuncVar(p, i, 2), 1 );
            pLits[2] = Abc_Var2Lit( Zyx_FuncVar(p, i, 3), 0 );
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, 3 ) )
                return 0;
        }
    }
    return 1;
}